

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::Init(Error *__return_storage_ptr__,JobManager *this,Config *aConf)

{
  ErrorCode EVar1;
  undefined3 uVar2;
  uint32_t uVar3;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  (this->mDefaultConf).mMaxConnectionNum = aConf->mMaxConnectionNum;
  uVar2 = *(undefined3 *)&aConf->field_0x1;
  uVar3 = aConf->mKeepAliveInterval;
  (this->mDefaultConf).mEnableCcm = aConf->mEnableCcm;
  *(undefined3 *)&(this->mDefaultConf).field_0x1 = uVar2;
  (this->mDefaultConf).mKeepAliveInterval = uVar3;
  (this->mDefaultConf).mLogger.
  super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aConf->mLogger).super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mDefaultConf).mLogger.
              super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(aConf->mLogger).
              super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->mDefaultConf).mEnableDtlsDebugLogging = aConf->mEnableDtlsDebugLogging;
  std::__cxx11::string::_M_assign((string *)&(this->mDefaultConf).mDomainName);
  std::__cxx11::string::_M_assign((string *)&(this->mDefaultConf).mId);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mDefaultConf).mPSKc,&aConf->mPSKc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mDefaultConf).mPrivateKey,&aConf->mPrivateKey);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mDefaultConf).mCertificate,&aConf->mCertificate);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mDefaultConf).mTrustAnchor,&aConf->mTrustAnchor);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mDefaultConf).mCommissionerToken,&aConf->mCommissionerToken);
  std::__cxx11::string::_M_assign((string *)&(this->mDefaultConf).mThreadSMRoot);
  security_material::Init((Error *)local_58,aConf);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    CommissionerAppCreate((Error *)local_58,&this->mDefaultCommissioner,aConf);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50)
    ;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::Init(const Config &aConf)
{
    Error error;

    mDefaultConf = aConf;
    SuccessOrExit(error = security_material::Init(aConf));
    SuccessOrExit(error = CommissionerAppCreate(mDefaultCommissioner, aConf));
exit:
    return error;
}